

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemiterator_unix.cpp
# Opt level: O0

void __thiscall QFileSystemIterator::~QFileSystemIterator(QFileSystemIterator *this)

{
  unique_ptr<__dirstream,_QFileSystemIterator::DirStreamCloser> *unaff_retaddr;
  
  QStringDecoder::~QStringDecoder((QStringDecoder *)0x6a5d80);
  std::unique_ptr<__dirstream,_QFileSystemIterator::DirStreamCloser>::~unique_ptr(unaff_retaddr);
  QString::~QString((QString *)0x6a5d98);
  return;
}

Assistant:

QFileSystemIterator::~QFileSystemIterator() = default;